

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::StencilTexturing::FunctionalTest::prepareProgram
          (FunctionalTest *this,bool is_draw,bool is_stencil)

{
  char *pcVar1;
  undefined *puVar2;
  GLuint GVar3;
  long lVar4;
  undefined1 *puVar5;
  undefined **ppuVar6;
  undefined8 *puVar7;
  GLchar *text;
  undefined7 in_register_00000031;
  char *pcVar8;
  string *string;
  GLchar *pGVar9;
  long *plVar10;
  GLchar *pGVar11;
  GLchar *shader_templates [5];
  size_t position;
  string shader_code [5];
  undefined *local_118 [5];
  FunctionalTest *local_f0;
  GLchar *local_e8;
  size_t local_e0;
  string local_d8;
  GLchar *local_b8;
  GLchar *local_98;
  GLchar *local_78;
  GLchar *local_58 [2];
  long local_48 [3];
  
  if ((int)CONCAT71(in_register_00000031,is_draw) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,m_compute_shader_code,(allocator<char> *)local_118);
    puVar2 = m_sampler_definition_stencil;
    pGVar11 = m_sampler_definition_depth;
    ppuVar6 = &m_image_definition_depth;
    if (is_stencil) {
      ppuVar6 = &m_image_definition_stencil;
    }
    puVar7 = &m_output_type_depth;
    if (is_stencil) {
      puVar7 = &m_output_type_stencil;
    }
    local_118[0] = (undefined *)0x0;
    pGVar9 = (GLchar *)*puVar7;
    Utils::replaceToken("IMAGE_DEFINITION",(size_t *)local_118,*ppuVar6,&local_d8);
    if (is_stencil) {
      pGVar11 = puVar2;
    }
    Utils::replaceToken("SAMPLER_DEFINITION",(size_t *)local_118,pGVar11,&local_d8);
    Utils::replaceToken("TYPE",(size_t *)local_118,pGVar9,&local_d8);
    GVar3 = Utils::createAndBuildProgram
                      ((this->super_TestCase).m_context,local_d8._M_dataplus._M_p,(GLchar *)0x0,
                       (GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    lVar4 = 0x10;
    do {
      puVar5 = (undefined1 *)((long)&local_d8._M_dataplus._M_p + lVar4);
      *(undefined1 **)((long)&local_e8 + lVar4) = puVar5;
      *(undefined8 *)((long)&local_e0 + lVar4) = 0;
      *puVar5 = 0;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0xb0);
    local_118[0] = m_fragment_shader_code;
    local_118[1] = m_geometry_shader_code;
    local_118[2] = m_tesselation_control_shader_code;
    local_118[3] = m_tesselation_evaluation_shader_code;
    pGVar9 = m_sampler_definition_stencil;
    pGVar11 = m_expected_value_stencil;
    if (!is_stencil) {
      pGVar9 = m_sampler_definition_depth;
      pGVar11 = m_expected_value_depth;
    }
    puVar7 = &m_output_type_depth;
    if (is_stencil) {
      puVar7 = &m_output_type_stencil;
    }
    local_118[4] = m_vertex_shader_code;
    local_e8 = (GLchar *)*puVar7;
    string = &local_d8;
    lVar4 = 0;
    local_f0 = this;
    do {
      local_e0 = 0;
      pcVar8 = *(char **)((long)local_118 + lVar4);
      pcVar1 = *(char **)((long)&local_d8._M_string_length + lVar4 * 4);
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)string,0,pcVar1,(ulong)pcVar8);
      if (lVar4 == 0) {
        Utils::replaceToken("TYPE",&local_e0,local_e8,string);
        pcVar8 = "SAMPLER_DEFINITION";
        text = pGVar9;
      }
      else {
        Utils::replaceToken("SAMPLER_DEFINITION",&local_e0,pGVar9,string);
        pcVar8 = "EXPECTED_VALUE";
        text = pGVar11;
      }
      Utils::replaceToken(pcVar8,&local_e0,text,string);
      lVar4 = lVar4 + 8;
      string = string + 1;
    } while (lVar4 != 0x28);
    GVar3 = Utils::createAndBuildProgram
                      ((local_f0->super_TestCase).m_context,(GLchar *)0x0,local_d8._M_dataplus._M_p,
                       local_b8,local_98,local_78,local_58[0]);
    lVar4 = -0xa0;
    plVar10 = local_48;
    do {
      if (plVar10 != (long *)plVar10[-2]) {
        operator_delete((long *)plVar10[-2],*plVar10 + 1);
      }
      plVar10 = plVar10 + -4;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0);
  }
  return GVar3;
}

Assistant:

GLuint FunctionalTest::prepareProgram(bool is_draw, bool is_stencil)
{
	GLuint program_id = 0;

	if (true != is_draw)
	{
		std::string   cs_code			 = m_compute_shader_code;
		const GLchar* image_definition   = m_image_definition_stencil;
		size_t		  position			 = 0;
		const GLchar* sampler_definition = m_sampler_definition_stencil;
		const GLchar* type				 = m_output_type_stencil;

		if (false == is_stencil)
		{
			image_definition   = m_image_definition_depth;
			sampler_definition = m_sampler_definition_depth;
			type			   = m_output_type_depth;
		}

		Utils::replaceToken("IMAGE_DEFINITION", position, image_definition, cs_code);
		Utils::replaceToken("SAMPLER_DEFINITION", position, sampler_definition, cs_code);
		Utils::replaceToken("TYPE", position, type, cs_code);

		program_id = Utils::createAndBuildProgram(m_context, cs_code.c_str(), 0 /* fs_code */, 0 /* gs_code */,
												  0 /* tcs_code */, 0 /* tes_code */, 0 /* vs_code */);
	}
	else
	{
#define N_FUNCTIONAL_TEST_SHADER_STAGES 5

		const GLchar* expected_value	 = m_expected_value_stencil;
		const GLchar* sampler_definition = m_sampler_definition_stencil;
		std::string   shader_code[N_FUNCTIONAL_TEST_SHADER_STAGES];
		const GLchar* shader_templates[N_FUNCTIONAL_TEST_SHADER_STAGES] = {
			m_fragment_shader_code, m_geometry_shader_code, m_tesselation_control_shader_code,
			m_tesselation_evaluation_shader_code, m_vertex_shader_code
		};
		const GLchar* type = m_output_type_stencil;

		if (false == is_stencil)
		{
			expected_value	 = m_expected_value_depth;
			sampler_definition = m_sampler_definition_depth;
			type			   = m_output_type_depth;
		}

		for (GLuint i = 0; i < N_FUNCTIONAL_TEST_SHADER_STAGES; ++i)
		{
			size_t position = 0;

			shader_code[i] = shader_templates[i];

			if (0 == i)
			{
				Utils::replaceToken("TYPE", position, type, shader_code[i]);
				Utils::replaceToken("SAMPLER_DEFINITION", position, sampler_definition, shader_code[i]);
				//Utils::replaceToken("TYPE",               position, type,               shader_code[i]);
			}
			else
			{
				Utils::replaceToken("SAMPLER_DEFINITION", position, sampler_definition, shader_code[i]);
				Utils::replaceToken("EXPECTED_VALUE", position, expected_value, shader_code[i]);
			}
		}

		program_id =
			Utils::createAndBuildProgram(m_context, 0 /* cs_code */, shader_code[0].c_str() /* fs_code  */,
										 shader_code[1].c_str() /* gs_code  */, shader_code[2].c_str() /* tcs_code */,
										 shader_code[3].c_str() /* tes_code */, shader_code[4].c_str() /* vs_code  */);
	}

	/* Done */
	return program_id;
}